

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

DispatchBuilder * __thiscall
kern::DispatchBuilder::chain
          (DispatchBuilder *this,
          unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *dispatch)

{
  bool bVar1;
  void *__s;
  invalid_argument *this_00;
  pointer pDVar2;
  function<void_(const_kern::Metadata_&,_const_char_*,_char_*)> *in_RSI;
  DispatchBuilder *in_RDI;
  shared_ptr<kern::Sink> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  LogLevel in_stack_ffffffffffffffb7;
  function<void_(const_kern::Metadata_&,_const_char_*,_char_*)> *in_stack_ffffffffffffffc8;
  
  if (in_RDI->inner == (Dispatch *)0x0) {
    __s = (void *)__cxa_allocate_exception(8);
    memset(__s,0,8);
    BuilderReuseException::BuilderReuseException
              ((BuilderReuseException *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    __cxa_throw(__s,&BuilderReuseException::typeinfo,BuilderReuseException::~BuilderReuseException);
  }
  bVar1 = std::operator==((unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"dispatch argument is NULL");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((in_RDI->inner->is_def_format & 1U) == 0) &&
     (pDVar2 = std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>::operator->
                         ((unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *)
                          0x10c9e6), (pDVar2->is_def_format & 1U) != 0)) {
    std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>::operator->
              ((unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *)0x10ca06);
    std::function<void_(const_kern::Metadata_&,_const_char_*,_char_*)>::operator=
              (in_RSI,in_stack_ffffffffffffffc8);
  }
  if (((in_RDI->inner->is_def_level & 1U) == 0) &&
     (pDVar2 = std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>::operator->
                         ((unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *)
                          0x10ca2f), (pDVar2->is_def_level & 1U) != 0)) {
    in_stack_ffffffffffffffb7 = in_RDI->inner->log_level;
    pDVar2 = std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>::operator->
                       ((unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *)0x10ca4e
                       );
    pDVar2->log_level = in_stack_ffffffffffffffb7;
  }
  std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>::operator->
            ((unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *)0x10ca5f);
  bVar1 = std::operator==((shared_ptr<kern::Sink> *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
  if (bVar1) {
    in_stack_ffffffffffffffa8 = &in_RDI->inner->output_sink;
    std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>::operator->
              ((unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *)0x10ca8f);
    std::shared_ptr<kern::Sink>::operator=
              ((shared_ptr<kern::Sink> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  std::
  vector<std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>,_std::allocator<std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>_>_>
  ::push_back((vector<std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>,_std::allocator<std::unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
              (value_type *)in_stack_ffffffffffffffa8);
  return in_RDI;
}

Assistant:

DispatchBuilder &DispatchBuilder::chain(std::unique_ptr<Dispatch> dispatch) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        if(dispatch == nullptr)
            throw std::invalid_argument("dispatch argument is NULL");

        // inherit format function
        if(!this->inner->is_def_format && dispatch->is_def_format)
            dispatch->format_func = this->inner->format_func;

        // inherit log level
        if(!this->inner->is_def_level && dispatch->is_def_level)
            dispatch->log_level = this->inner->log_level;

        // inherit sink
        if(dispatch->output_sink == nullptr)
            dispatch->output_sink = this->inner->output_sink;

        this->inner->chain.push_back(std::move(dispatch));

        return *this;
    }